

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::Instr::TransferTo(Instr *this,Instr *instr)

{
  ushort uVar1;
  Opnd *this_00;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  
  if (instr->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc64,"(instr->m_dst == nullptr)","instr->m_dst == nullptr");
    if (!bVar4) goto LAB_004c0d8e;
    *puVar6 = 0;
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc65,"(instr->m_src1 == nullptr)","instr->m_src1 == nullptr");
    if (!bVar4) goto LAB_004c0d8e;
    *puVar6 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xc66,"(instr->m_src2 == nullptr)","instr->m_src2 == nullptr");
    if (!bVar4) goto LAB_004c0d8e;
    *puVar6 = 0;
  }
  uVar7 = *(ushort *)&this->field_0x36 & 2;
  uVar1 = *(ushort *)&instr->field_0x36;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xfffd | uVar7;
  uVar8 = *(ushort *)&this->field_0x36 & 4;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xfff9 | uVar7 | uVar8;
  uVar9 = *(ushort *)&this->field_0x36 & 8;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xfff1 | uVar7 | uVar8 | uVar9;
  uVar10 = *(ushort *)&this->field_0x36 & 0x10;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xffe1 | uVar7 | uVar8 | uVar9 | uVar10;
  instr->field_0x38 = instr->field_0x38 & 0xf7 | this->field_0x38 & 8;
  uVar11 = *(ushort *)&this->field_0x36 & 0x40;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xffa1 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11;
  uVar12 = *(ushort *)&this->field_0x36 & 0x80;
  *(ushort *)&instr->field_0x36 = uVar1 & 0xff21 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12;
  uVar13 = *(ushort *)&this->field_0x36 & 0x100;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xfe21 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13;
  instr->ignoreOverflowBitCount = this->ignoreOverflowBitCount;
  uVar14 = *(ushort *)&this->field_0x36 & 0x400;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xfa21 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14;
  uVar15 = *(ushort *)&this->field_0x36 & 0x800;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xf221 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15;
  uVar16 = *(ushort *)&this->field_0x36 & 0x1000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xe221 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15
       | uVar16;
  instr->m_number = this->m_number;
  instr->m_src1 = this->m_src1;
  instr->m_src2 = this->m_src2;
  uVar17 = *(ushort *)&this->field_0x36 & 0x4000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0xa221 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15
       | uVar16 | uVar17;
  uVar18 = *(ushort *)&this->field_0x36 & 0x8000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0x2221 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15
       | uVar16 | uVar17 | uVar18;
  instr->dataWidth = this->dataWidth;
  uVar19 = *(ushort *)&this->field_0x36 & 0x2000;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0x221 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 |
       uVar16 | uVar17 | uVar18 | uVar19;
  *(ushort *)&instr->field_0x36 =
       uVar1 & 0x21 | uVar7 | uVar8 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 |
       uVar16 | uVar17 | uVar18 | uVar19 | *(ushort *)&this->field_0x36 & 0x200;
  this_00 = this->m_dst;
  if (this_00 != (Opnd *)0x0) {
    instr->m_dst = this_00;
    this->m_dst = (Opnd *)0x0;
    OVar5 = Opnd::GetKind(this_00);
    if (OVar5 != OpndKindReg) goto LAB_004c0d7b;
    OVar5 = Opnd::GetKind(this_00);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_004c0d8e;
      *puVar6 = 0;
    }
    pp_Var2 = this_00[1]._vptr_Opnd;
    if ((*(char *)((long)pp_Var2 + 0x14) != '\x01') || (((ulong)pp_Var2[3] & 1) == 0))
    goto LAB_004c0d7b;
    if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) goto LAB_004c0d8e;
      *puVar6 = 0;
    }
    if ((Instr *)pp_Var2[5] != this) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xc84,"(sym->AsStackSym()->m_instrDef == this)",
                         "sym->AsStackSym()->m_instrDef == this");
      if (!bVar4) goto LAB_004c0d8e;
      *puVar6 = 0;
    }
    if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar4) {
LAB_004c0d8e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pp_Var2[5] = (_func_int *)instr;
  }
LAB_004c0d7b:
  this->m_src1 = (Opnd *)0x0;
  this->m_src2 = (Opnd *)0x0;
  return;
}

Assistant:

void
Instr::TransferTo(Instr * instr)
{
    Assert(instr->m_dst == nullptr);
    Assert(instr->m_src1 == nullptr);
    Assert(instr->m_src2 == nullptr);
    this->TransferDstAttributesTo(instr);
    instr->usesStackArgumentsObject = this->usesStackArgumentsObject;
    instr->isCloned = this->isCloned;
    instr->ignoreNegativeZero = this->ignoreNegativeZero;
    instr->ignoreIntOverflow = this->ignoreIntOverflow;
    instr->ignoreIntOverflowInRange = this->ignoreIntOverflowInRange;
    instr->ignoreOverflowBitCount = this->ignoreOverflowBitCount;
    instr->loadedArrayHeadSegment = this->loadedArrayHeadSegment;
    instr->loadedArrayHeadSegmentLength = this->loadedArrayHeadSegmentLength;
    instr->extractedUpperBoundCheckWithoutHoisting = this->extractedUpperBoundCheckWithoutHoisting;
    instr->m_number = this->m_number;
    instr->m_src1 = this->m_src1;
    instr->m_src2 = this->m_src2;
    instr->dstIsAlwaysConvertedToInt32 = this->dstIsAlwaysConvertedToInt32;
    instr->dstIsAlwaysConvertedToNumber = this->dstIsAlwaysConvertedToNumber;
    instr->dataWidth = this->dataWidth;
    instr->isCtorCall = this->isCtorCall;
    instr->forcePreOpBailOutIfNeeded = this->forcePreOpBailOutIfNeeded;
    IR::Opnd * dst = this->m_dst;

    if (dst)
    {
        instr->m_dst = dst;
        this->m_dst = nullptr;
        if (dst->IsRegOpnd())
        {
            Sym * sym = dst->AsRegOpnd()->m_sym;
            if (sym->IsStackSym() && sym->AsStackSym()->m_isSingleDef)
            {
                Assert(sym->AsStackSym()->m_instrDef == this);
                StackSym * stackSym = sym->AsStackSym();
                stackSym->m_instrDef = instr;
            }
        }
    }

    this->m_src1 = nullptr;
    this->m_src2 = nullptr;
}